

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpAcceptor.cpp
# Opt level: O0

void __thiscall
gmlc::networking::TcpAcceptor::TcpAcceptor(TcpAcceptor *this,io_context *io_context,uint16_t port)

{
  undefined8 in_RSI;
  long in_RDI;
  TriggerVariable *this_00;
  address *in_stack_ffffffffffffff68;
  undefined1 active;
  function<void_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::shared_ptr<gmlc::networking::TcpConnection>)>
  *in_stack_ffffffffffffff70;
  defaulted_constraint local_39;
  int local_38 [10];
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::enable_shared_from_this<gmlc::networking::TcpAcceptor>::enable_shared_from_this
            ((enable_shared_from_this<gmlc::networking::TcpAcceptor> *)0x72fb84);
  asio::ip::address_v4::any();
  asio::ip::address::address
            ((address *)in_stack_ffffffffffffff70,(address_v4 *)in_stack_ffffffffffffff68);
  asio::ip::basic_endpoint<asio::ip::tcp>::basic_endpoint
            ((basic_endpoint<asio::ip::tcp> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0)
  ;
  local_38[0] = (int)asio::ip::basic_endpoint<asio::ip::tcp>::protocol
                               ((basic_endpoint<asio::ip::tcp> *)in_stack_ffffffffffffff68);
  asio::defaulted_constraint::defaulted_constraint(&local_39);
  asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::
  basic_socket_acceptor<asio::io_context>
            ((basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *)(in_RDI + 0x30),local_10
             ,local_38);
  active = (undefined1)((ulong)(in_RDI + 0x88) >> 0x38);
  std::
  function<void_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::shared_ptr<gmlc::networking::TcpConnection>)>
  ::function(in_stack_ffffffffffffff70);
  this_00 = (TriggerVariable *)(in_RDI + 0xa8);
  std::function<bool_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_const_std::error_code_&)>::
  function((function<bool_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_const_std::error_code_&)>
            *)this_00);
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)this_00);
  std::atomic<gmlc::networking::TcpAcceptor::AcceptingStates>::atomic
            ((atomic<gmlc::networking::TcpAcceptor::AcceptingStates> *)(in_RDI + 0xe8),CONNECTED);
  concurrency::TriggerVariable::TriggerVariable(this_00,(bool)active);
  return;
}

Assistant:

TcpAcceptor::TcpAcceptor(asio::io_context& io_context, uint16_t port) :
    endpoint_(asio::ip::address_v4::any(), port),
    acceptor_(io_context, endpoint_.protocol()),
    state(AcceptingStates::CONNECTED)
{
}